

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::anon_unknown_0::ReconstructGPrimProperties
               (Specifier *spec,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *properties,GPrim *gprim,string *warn,string *err,
               bool strict_allowedToken_check)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  size_type sVar4;
  Attribute *pAVar5;
  AttrMeta *pAVar6;
  AttrMeta *pAVar7;
  ostream *poVar8;
  ParseResult *prop_00;
  string *name;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  bool local_21f9;
  bool local_21b9;
  bool local_2179;
  Collection *local_2128;
  MaterialBinding *local_2108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20e0 [39];
  allocator local_20b9;
  string local_20b8 [32];
  fmt local_2098 [32];
  ostringstream local_2078 [8];
  ostringstream ss_e_4;
  allocator local_1ef9;
  string local_1ef8;
  string local_1ed8;
  undefined1 local_1eb8 [8];
  ParseResult ret_1;
  allocator local_1e79;
  value_type local_1e78 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1e58;
  allocator local_1e31;
  string local_1e30;
  undefined1 local_1e10 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_2;
  Attribute *attr_3;
  allocator local_1dd1;
  value_type local_1dd0 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1db0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d90 [32];
  ostringstream local_1d70 [8];
  ostringstream ss_w_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bf8;
  string local_1bd8;
  allocator local_1bb1;
  key_type local_1bb0 [4];
  _Base_ptr local_1b90;
  undefined1 local_1b88;
  allocator local_1b79;
  value_type local_1b78 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1b58;
  allocator local_1b31;
  string local_1b30;
  undefined1 local_1b10 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_2;
  allocator local_1ad1;
  value_type local_1ad0 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ab0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a90 [32];
  ostringstream local_1a70 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18f8;
  string local_18d8;
  allocator local_18b1;
  key_type local_18b0 [4];
  _Base_ptr local_1890;
  undefined1 local_1888;
  allocator local_1879;
  value_type local_1878 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1858;
  allocator local_1831;
  string local_1830;
  undefined1 local_1810 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr_1;
  allocator local_17d1;
  value_type local_17d0 [4];
  Attribute *local_17b0;
  Attribute *attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1788 [32];
  ostringstream local_1768 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15f0;
  string local_15d0;
  allocator local_15a9;
  key_type local_15a8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1568 [39];
  allocator local_1541;
  string local_1540 [32];
  string local_1520;
  ostringstream local_1500 [8];
  ostringstream ss_e_3;
  int local_1388;
  allocator local_1381;
  string local_1380;
  string local_1360;
  undefined1 local_1340 [8];
  ParseResult ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f8 [39];
  allocator local_12d1;
  string local_12d0 [32];
  string local_12b0;
  ostringstream local_1290 [8];
  ostringstream ss_e_2;
  RelationshipProperty local_1108;
  _Base_ptr local_df8;
  undefined1 local_df0;
  RelationshipProperty local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8 [39];
  allocator local_a91;
  string local_a90 [32];
  string local_a70;
  ostringstream local_a50 [8];
  ostringstream ss_e_1;
  RelationshipProperty local_8c8;
  _Base_ptr local_5b8;
  undefined1 local_5b0;
  RelationshipProperty local_5a8;
  Relationship *local_298;
  Relationship *rel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [39];
  allocator local_249;
  string local_248 [32];
  string local_228;
  ostringstream local_208 [8];
  ostringstream ss_e;
  allocator local_89;
  key_type local_88 [4];
  reference_conflict local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *__range2;
  bool strict_allowedToken_check_local;
  string *err_local;
  string *warn_local;
  GPrim *gprim_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *properties_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *table_local;
  Specifier *spec_local;
  
  bVar1 = ReconstructXformOpsFromProperties
                    (spec,table,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)gprim,err);
  if (!bVar1) {
    spec_local._7_1_ = 0;
    goto LAB_0028ac77;
  }
  local_2108 = (MaterialBinding *)0x0;
  if (gprim != (GPrim *)0x0) {
    local_2108 = &gprim->super_MaterialBinding;
  }
  bVar1 = ReconstructMaterialBindingProperties(table,properties,local_2108,err);
  if (!bVar1) {
    spec_local._7_1_ = 0;
    goto LAB_0028ac77;
  }
  local_2128 = (Collection *)0x0;
  if (gprim != (GPrim *)0x0) {
    local_2128 = &gprim->super_Collection;
  }
  prop_00 = (ParseResult *)warn;
  bVar1 = ReconstructCollectionProperties
                    (table,properties,local_2128,warn,err,strict_allowedToken_check);
  if (!bVar1) {
    spec_local._7_1_ = 0;
    goto LAB_0028ac77;
  }
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   *)properties);
LAB_0028923e:
  bVar1 = ::std::operator!=(&__end2,(_Self *)&prop);
  if (!bVar1) goto LAB_0028ac73;
  local_68 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
             ::operator*(&__end2);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,"proxyPrim");
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_88,"proxyPrim",&local_89);
    sVar4 = ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(table,local_88);
    ::std::__cxx11::string::~string((string *)local_88);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
    if (sVar4 != 0) goto LAB_0028ac65;
    bVar1 = Property::is_relationship(&local_68->second);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_208);
      poVar8 = ::std::operator<<((ostream *)local_208,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructGPrimProperties");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xabd);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_248,"Property `{}` must be a Relationship.",&local_249);
      fmt::format<char_const*>(&local_228,(fmt *)local_248,(string *)&kProxyPrim,(char **)prop_00);
      poVar8 = ::std::operator<<((ostream *)local_208,(string *)&local_228);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)&local_228);
      ::std::__cxx11::string::~string(local_248);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_270,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rel);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_270);
        ::std::__cxx11::string::~string((string *)local_270);
        ::std::__cxx11::string::~string((string *)&rel);
      }
      spec_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_208);
      goto LAB_0028ac77;
    }
    local_298 = Property::get_relationship(&local_68->second);
    bVar1 = Relationship::is_path(local_298);
    if (bVar1) {
      RelationshipProperty::RelationshipProperty(&local_5a8,local_298);
      RelationshipProperty::operator=(&gprim->proxyPrim,&local_5a8);
      RelationshipProperty::~RelationshipProperty(&local_5a8);
      pVar9 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(table,&local_68->first);
      local_5b8 = (_Base_ptr)pVar9.first._M_node;
      local_5b0 = pVar9.second;
      goto LAB_0028ac65;
    }
    bVar1 = Relationship::is_pathvector(local_298);
    if (bVar1) {
      sVar3 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        (&local_298->targetPathVector);
      if (sVar3 != 1) {
        ::std::__cxx11::ostringstream::ostringstream(local_a50);
        poVar8 = ::std::operator<<((ostream *)local_a50,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructGPrimProperties");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xabd);
        ::std::operator<<(poVar8," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a90,"`{}` target is empty or has mutiple Paths. Must be single Path.",
                   &local_a91);
        fmt::format<char_const*>(&local_a70,(fmt *)local_a90,(string *)&kProxyPrim,(char **)prop_00)
        ;
        poVar8 = ::std::operator<<((ostream *)local_a50,(string *)&local_a70);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::string::~string((string *)&local_a70);
        ::std::__cxx11::string::~string(local_a90);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a91);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_ab8,local_ad8);
          ::std::__cxx11::string::operator=((string *)err,(string *)local_ab8);
          ::std::__cxx11::string::~string((string *)local_ab8);
          ::std::__cxx11::string::~string((string *)local_ad8);
        }
        spec_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_a50);
        goto LAB_0028ac77;
      }
      RelationshipProperty::RelationshipProperty(&local_8c8,local_298);
      RelationshipProperty::operator=(&gprim->proxyPrim,&local_8c8);
      RelationshipProperty::~RelationshipProperty(&local_8c8);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(table,&local_68->first);
      goto LAB_0028ac65;
    }
    bVar1 = Relationship::has_value(local_298);
    if (!bVar1) {
      RelationshipProperty::RelationshipProperty(&local_de8,local_298);
      RelationshipProperty::operator=(&gprim->proxyPrim,&local_de8);
      RelationshipProperty::~RelationshipProperty(&local_de8);
      pVar9 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(table,&local_68->first);
      local_df8 = (_Base_ptr)pVar9.first._M_node;
      local_df0 = pVar9.second;
      goto LAB_00289914;
    }
    bVar1 = Relationship::is_blocked(local_298);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1290);
      poVar8 = ::std::operator<<((ostream *)local_1290,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructGPrimProperties");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xabd);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_12d0,"Internal error. Property `{}` is not a valid Relationship.",&local_12d1
                );
      fmt::format<char_const*>(&local_12b0,(fmt *)local_12d0,(string *)&kProxyPrim,(char **)prop_00)
      ;
      poVar8 = ::std::operator<<((ostream *)local_1290,(string *)&local_12b0);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)&local_12b0);
      ::std::__cxx11::string::~string(local_12d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_12d1);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_12f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ret.err.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=((string *)err,(string *)local_12f8);
        ::std::__cxx11::string::~string((string *)local_12f8);
        ::std::__cxx11::string::~string((string *)(ret.err.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1290);
      goto LAB_0028ac77;
    }
    RelationshipProperty::RelationshipProperty(&local_1108,local_298);
    RelationshipProperty::operator=(&gprim->proxyPrim,&local_1108);
    RelationshipProperty::~RelationshipProperty(&local_1108);
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(table,&local_68->first);
  }
LAB_00289914:
  ::std::__cxx11::string::string((string *)&local_1360,(string *)local_68);
  prop_00 = (ParseResult *)&local_68->second;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1380,"doubleSided",&local_1381);
  name = &local_1380;
  ParseTypedAttribute<bool>
            ((ParseResult *)local_1340,table,&local_1360,(Property *)prop_00,name,
             &gprim->doubleSided);
  ::std::__cxx11::string::~string((string *)&local_1380);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1381);
  ::std::__cxx11::string::~string((string *)&local_1360);
  if ((local_1340._0_4_ == Success) || (local_1340._0_4_ == AlreadyProcessed)) {
    local_1388 = 3;
  }
  else if (local_1340._0_4_ == Unmatched) {
    local_1388 = 0;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1500);
    poVar8 = ::std::operator<<((ostream *)local_1500,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructGPrimProperties");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xabe);
    ::std::operator<<(poVar8," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1540,"Parsing attribute `{}` failed. Error: {}",&local_1541);
    prop_00 = &ret;
    fmt::format<char[12],std::__cxx11::string>
              (&local_1520,(fmt *)local_1540,(string *)"doubleSided",(char (*) [12])prop_00,name);
    poVar8 = ::std::operator<<((ostream *)local_1500,(string *)&local_1520);
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::string::~string((string *)&local_1520);
    ::std::__cxx11::string::~string(local_1540);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1541);
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::operator+(local_1568,local_1588);
      ::std::__cxx11::string::operator=((string *)err,(string *)local_1568);
      ::std::__cxx11::string::~string((string *)local_1568);
      ::std::__cxx11::string::~string((string *)local_1588);
    }
    spec_local._7_1_ = 0;
    local_1388 = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_1500);
  }
  ParseResult::~ParseResult((ParseResult *)local_1340);
  if (local_1388 == 0) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,"visibility");
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_15a8,"visibility",&local_15a9);
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(table,local_15a8);
      ::std::__cxx11::string::~string((string *)local_15a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_15a9);
      if (sVar4 == 0) {
        Property::value_type_name_abi_cxx11_(&local_15d0,&local_68->second);
        tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
        _Var2 = ::std::operator==(&local_15d0,&local_15f0);
        prop_00 = (ParseResult *)CONCAT71((int7)((ulong)prop_00 >> 8),_Var2);
        local_2179 = false;
        if (_Var2) {
          bVar1 = Property::is_attribute(&local_68->second);
          prop_00 = (ParseResult *)CONCAT71((int7)((ulong)prop_00 >> 8),bVar1);
          local_2179 = false;
          if (bVar1) {
            local_2179 = Property::is_empty(&local_68->second);
          }
        }
        ::std::__cxx11::string::~string((string *)&local_15f0);
        ::std::__cxx11::string::~string((string *)&local_15d0);
        if (local_2179 == false) {
          fun._M_invoker = (_Invoker_type)Property::get_attribute(&local_68->second);
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
          ::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                    ((function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
                      *)local_1810,VisibilityEnumHandler);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_1830,"visibility",&local_1831);
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function(&local_1858,
                     (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_1810);
          prop_00 = (ParseResult *)fun._M_invoker;
          bVar1 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                            (&local_1830,strict_allowedToken_check,&local_1858,
                             (Attribute *)fun._M_invoker,&gprim->visibility,warn,err);
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_1858);
          ::std::__cxx11::string::~string((string *)&local_1830);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1831);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            pAVar6 = Attribute::metas((Attribute *)fun._M_invoker);
            pAVar7 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::metas
                               (&gprim->visibility);
            AttrMetas::operator=(pAVar7,pAVar6);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_1878,"visibility",&local_1879);
            pVar9 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert(table,local_1878);
            local_1890 = (_Base_ptr)pVar9.first._M_node;
            local_1888 = pVar9.second;
            ::std::__cxx11::string::~string((string *)local_1878);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1879);
            local_1388 = 3;
          }
          else {
            spec_local._7_1_ = 0;
            local_1388 = 1;
          }
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_1810);
          goto joined_r0x0028a517;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_1768);
        poVar8 = ::std::operator<<((ostream *)local_1768,"[warn]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructGPrimProperties");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xac0);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_1768,"No value assigned to `");
        poVar8 = ::std::operator<<(poVar8,"visibility");
        poVar8 = ::std::operator<<(poVar8,"` token attribute. Set default token value.");
        ::std::operator<<(poVar8,"\n");
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_1788,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &attr);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_1788);
          ::std::__cxx11::string::~string((string *)local_1788);
          ::std::__cxx11::string::~string((string *)&attr);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1768);
        local_17b0 = Property::get_attribute(&local_68->second);
        pAVar6 = Attribute::metas(local_17b0);
        pAVar7 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::metas
                           (&gprim->visibility);
        AttrMetas::operator=(pAVar7,pAVar6);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_17d0,"visibility",&local_17d1);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(table,local_17d0);
        ::std::__cxx11::string::~string((string *)local_17d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_17d1);
      }
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68,"purpose");
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_18b0,"purpose",&local_18b1);
        sVar4 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(table,local_18b0);
        ::std::__cxx11::string::~string((string *)local_18b0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_18b1);
        if (sVar4 == 0) {
          Property::value_type_name_abi_cxx11_(&local_18d8,&local_68->second);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          _Var2 = ::std::operator==(&local_18d8,&local_18f8);
          prop_00 = (ParseResult *)CONCAT71((int7)((ulong)prop_00 >> 8),_Var2);
          local_21b9 = false;
          if (_Var2) {
            bVar1 = Property::is_attribute(&local_68->second);
            prop_00 = (ParseResult *)CONCAT71((int7)((ulong)prop_00 >> 8),bVar1);
            local_21b9 = false;
            if (bVar1) {
              local_21b9 = Property::is_empty(&local_68->second);
            }
          }
          ::std::__cxx11::string::~string((string *)&local_18f8);
          ::std::__cxx11::string::~string((string *)&local_18d8);
          if (local_21b9 == false) {
            fun_1._M_invoker = (_Invoker_type)Property::get_attribute(&local_68->second);
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
            ::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                      ((function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                        *)local_1b10,PurposeEnumHandler);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_1b30,"purpose",&local_1b31);
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function(&local_1b58,
                       (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_1b10);
            prop_00 = (ParseResult *)fun_1._M_invoker;
            bVar1 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                              (&local_1b30,strict_allowedToken_check,&local_1b58,
                               (Attribute *)fun_1._M_invoker,&gprim->purpose,warn,err);
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::~function(&local_1b58);
            ::std::__cxx11::string::~string((string *)&local_1b30);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1b31);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              pAVar6 = Attribute::metas((Attribute *)fun_1._M_invoker);
              pAVar7 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas(&gprim->purpose);
              AttrMetas::operator=(pAVar7,pAVar6);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_1b78,"purpose",&local_1b79);
              pVar9 = ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert(table,local_1b78);
              local_1b90 = (_Base_ptr)pVar9.first._M_node;
              local_1b88 = pVar9.second;
              ::std::__cxx11::string::~string((string *)local_1b78);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1b79);
              local_1388 = 3;
            }
            else {
              spec_local._7_1_ = 0;
              local_1388 = 1;
            }
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::~function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)local_1b10);
            goto joined_r0x0028a517;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_1a70);
          poVar8 = ::std::operator<<((ostream *)local_1a70,"[warn]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructGPrimProperties");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xac2);
          ::std::operator<<(poVar8," ");
          poVar8 = ::std::operator<<((ostream *)local_1a70,"No value assigned to `");
          poVar8 = ::std::operator<<(poVar8,"purpose");
          poVar8 = ::std::operator<<(poVar8,"` token attribute. Set default token value.");
          ::std::operator<<(poVar8,"\n");
          if (warn != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1a90,local_1ab0);
            ::std::__cxx11::string::operator=((string *)warn,(string *)local_1a90);
            ::std::__cxx11::string::~string((string *)local_1a90);
            ::std::__cxx11::string::~string((string *)local_1ab0);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_1a70);
          pAVar5 = Property::get_attribute(&local_68->second);
          pAVar6 = Attribute::metas(pAVar5);
          pAVar7 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas(&gprim->purpose);
          AttrMetas::operator=(pAVar7,pAVar6);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_1ad0,"purpose",&local_1ad1);
          ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(table,local_1ad0);
          ::std::__cxx11::string::~string((string *)local_1ad0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1ad1);
        }
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_68,"orientation");
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_1bb0,"orientation",&local_1bb1);
          sVar4 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(table,local_1bb0);
          ::std::__cxx11::string::~string((string *)local_1bb0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1bb1);
          if (sVar4 == 0) {
            Property::value_type_name_abi_cxx11_(&local_1bd8,&local_68->second);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var2 = ::std::operator==(&local_1bd8,&local_1bf8);
            prop_00 = (ParseResult *)CONCAT71((int7)((ulong)prop_00 >> 8),_Var2);
            local_21f9 = false;
            if (_Var2) {
              bVar1 = Property::is_attribute(&local_68->second);
              prop_00 = (ParseResult *)CONCAT71((int7)((ulong)prop_00 >> 8),bVar1);
              local_21f9 = false;
              if (bVar1) {
                local_21f9 = Property::is_empty(&local_68->second);
              }
            }
            ::std::__cxx11::string::~string((string *)&local_1bf8);
            ::std::__cxx11::string::~string((string *)&local_1bd8);
            if (local_21f9 == false) {
              fun_2._M_invoker = (_Invoker_type)Property::get_attribute(&local_68->second);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Orientation,std::__cxx11::string>(std::__cxx11::string_const&)>
              ::
              function<nonstd::expected_lite::expected<tinyusdz::Orientation,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                        ((function<nonstd::expected_lite::expected<tinyusdz::Orientation,std::__cxx11::string>(std::__cxx11::string_const&)>
                          *)local_1e10,OrientationEnumHandler);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_1e30,"orientation",&local_1e31);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_1e58,
                         (function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_1e10);
              prop_00 = (ParseResult *)fun_2._M_invoker;
              bVar1 = ParseUniformEnumProperty<tinyusdz::Orientation,tinyusdz::Orientation>
                                (&local_1e30,strict_allowedToken_check,&local_1e58,
                                 (Attribute *)fun_2._M_invoker,&gprim->orientation,warn,err);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function(&local_1e58);
              ::std::__cxx11::string::~string((string *)&local_1e30);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1e31);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                pAVar6 = Attribute::metas((Attribute *)fun_2._M_invoker);
                pAVar7 = TypedAttributeWithFallback<tinyusdz::Orientation>::metas
                                   (&gprim->orientation);
                AttrMetas::operator=(pAVar7,pAVar6);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)local_1e78,"orientation",&local_1e79);
                pVar9 = ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert(table,local_1e78);
                ret_1.err.field_2._8_8_ = pVar9.first._M_node;
                ::std::__cxx11::string::~string((string *)local_1e78);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1e79);
                local_1388 = 3;
              }
              else {
                spec_local._7_1_ = 0;
                local_1388 = 1;
              }
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)local_1e10);
              goto joined_r0x0028a517;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_1d70);
            poVar8 = ::std::operator<<((ostream *)local_1d70,"[warn]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReconstructGPrimProperties");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xac4);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)local_1d70,"No value assigned to `");
            poVar8 = ::std::operator<<(poVar8,"orientation");
            poVar8 = ::std::operator<<(poVar8,"` token attribute. Set default token value.");
            ::std::operator<<(poVar8,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_1d90,local_1db0);
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_1d90);
              ::std::__cxx11::string::~string((string *)local_1d90);
              ::std::__cxx11::string::~string((string *)local_1db0);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_1d70);
            pAVar5 = Property::get_attribute(&local_68->second);
            pAVar6 = Attribute::metas(pAVar5);
            pAVar7 = TypedAttributeWithFallback<tinyusdz::Orientation>::metas(&gprim->orientation);
            AttrMetas::operator=(pAVar7,pAVar6);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_1dd0,"orientation",&local_1dd1);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(table,local_1dd0);
            ::std::__cxx11::string::~string((string *)local_1dd0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1dd1);
          }
        }
        else {
          ::std::__cxx11::string::string((string *)&local_1ed8,(string *)local_68);
          prop_00 = (ParseResult *)&local_68->second;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_1ef8,"extent",&local_1ef9);
          ParseExtentAttribute
                    ((ParseResult *)local_1eb8,table,&local_1ed8,(Property *)prop_00,&local_1ef8,
                     &gprim->extent);
          ::std::__cxx11::string::~string((string *)&local_1ef8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1ef9);
          ::std::__cxx11::string::~string((string *)&local_1ed8);
          if ((local_1eb8._0_4_ == Success) || (local_1eb8._0_4_ == AlreadyProcessed)) {
            local_1388 = 3;
          }
          else if (local_1eb8._0_4_ == Unmatched) {
            local_1388 = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_2078);
            poVar8 = ::std::operator<<((ostream *)local_2078,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReconstructGPrimProperties");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xac5);
            ::std::operator<<(poVar8," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_20b8,"Parsing attribute `extent` failed. Error: {}",&local_20b9);
            fmt::format<std::__cxx11::string>
                      (local_2098,(string *)local_20b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret_1);
            poVar8 = ::std::operator<<((ostream *)local_2078,(string *)local_2098);
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::string::~string((string *)local_2098);
            ::std::__cxx11::string::~string(local_20b8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_20b9);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_20e0,local_2100);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_20e0);
              ::std::__cxx11::string::~string((string *)local_20e0);
              ::std::__cxx11::string::~string((string *)local_2100);
            }
            spec_local._7_1_ = 0;
            local_1388 = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_2078);
          }
          ParseResult::~ParseResult((ParseResult *)local_1eb8);
          if (local_1388 != 0) goto joined_r0x0028a517;
        }
      }
    }
  }
  else {
joined_r0x0028a517:
    if (local_1388 == 1) goto LAB_0028ac77;
  }
LAB_0028ac65:
  ::std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
  ::operator++(&__end2);
  goto LAB_0028923e;
LAB_0028ac73:
  spec_local._7_1_ = 1;
LAB_0028ac77:
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructGPrimProperties(
  const Specifier &spec,
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  GPrim *gprim, /* inout */
  std::string *warn,
  std::string *err,
  bool strict_allowedToken_check)
{

  (void)warn;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &gprim->xformOps, err)) {
    return false;
  }

  if (!prim::ReconstructMaterialBindingProperties(table, properties, gprim, err)) {
    return false;
  }

  if (!prim::ReconstructCollectionProperties(
    table, properties, gprim, warn, err, strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kProxyPrim, gprim->proxyPrim)
    PARSE_TYPED_ATTRIBUTE(table, prop, "doubleSided", GPrim, gprim->doubleSided)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, GPrim,
                   gprim->visibility, strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "purpose", Purpose, PurposeEnumHandler, GPrim,
                       gprim->purpose, strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "orientation", Orientation, OrientationEnumHandler, GPrim,
                       gprim->orientation, strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, "extent", GPrim, gprim->extent)
  }

  return true;
}